

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<char>::~ATNNode(ATNNode<char> *this)

{
  ATNNode<char> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0028f0a0;
  std::__cxx11::string::~string((string *)&this->m_literal);
  NFA<char>::~NFA(&this->m_nfa);
  Identifier::~Identifier(&this->m_invoke);
  std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
  ~vector(&this->m_transitions);
  return;
}

Assistant:

virtual ~ATNNode()
    {
    }